

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall
higan::LogFile::LogFile(LogFile *this,string *log_dir,string *log_prefix,bool thread_safe)

{
  time_t tVar1;
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,thread_safe) == 0) {
    (this->mutex_)._M_t.super___uniq_ptr_impl<higan::Mutex,_std::default_delete<higan::Mutex>_>._M_t
    .super__Tuple_impl<0UL,_higan::Mutex_*,_std::default_delete<higan::Mutex>_>.
    super__Head_base<0UL,_higan::Mutex_*,_false>._M_head_impl = (Mutex *)0x0;
  }
  else {
    std::make_unique<higan::Mutex>();
  }
  std::__cxx11::string::string((string *)&this->log_dir_,(string *)log_dir);
  std::__cxx11::string::string((string *)&this->log_prefix_,(string *)log_prefix);
  tVar1 = time((time_t *)0x0);
  this->last_flush_time_ = tVar1;
  tVar1 = time((time_t *)0x0);
  this->last_roll_time_ = tVar1;
  (this->file_ptr_)._M_t.
  super___uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>._M_t.
  super__Tuple_impl<0UL,_higan::FileForAppend_*,_std::default_delete<higan::FileForAppend>_>.
  super__Head_base<0UL,_higan::FileForAppend_*,_false>._M_head_impl = (FileForAppend *)0x0;
  RollFile(this);
  return;
}

Assistant:

LogFile::LogFile(const std::string& log_dir, const std::string& log_prefix, bool thread_safe) :
		mutex_(thread_safe ? std::make_unique<Mutex>() : nullptr),
		log_dir_(log_dir),
		log_prefix_(log_prefix),
		last_flush_time_(time(nullptr)),
		last_roll_time_(time(nullptr)),
		file_ptr_(nullptr)
{
	RollFile();
}